

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeDumper.cpp
# Opt level: O0

void Js::AsmJsByteCodeDumper::
     DumpElementSlot<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
               (OpCodeAsmJs op,OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *data
               ,FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  UnsignedType UVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  uint32 uVar6;
  int iVar7;
  AsmJsFunctionInfo *this;
  WasmReaderInfo *pWVar8;
  WebAssemblyModule *pWVar9;
  WasmFunctionInfo *this_00;
  FunctionBody *pFVar10;
  undefined4 extraout_var;
  undefined4 *puVar11;
  WasmFunctionInfo *loadedFunc;
  uint funcIndex;
  uint index;
  WasmReaderInfo *wasmInfo;
  AsmJsFunctionInfo *asmInfo;
  ByteCodeReader *reader_local;
  FunctionBody *dumpFunction_local;
  OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *data_local;
  OpCodeAsmJs op_local;
  
  if ((ushort)(op - LdSlotArr) < 2) {
    this = FunctionBody::GetAsmJsFunctionInfo(dumpFunction);
    pWVar8 = AsmJsFunctionInfo::GetWasmReaderInfo(this);
    if (pWVar8 != (WasmReaderInfo *)0x0) {
      UVar1 = data->SlotIndex;
      pWVar9 = Memory::WriteBarrierPtr<Js::WebAssemblyModule>::operator->(&pWVar8->m_module);
      uVar5 = WebAssemblyModule::GetFuncOffset(pWVar9);
      pWVar9 = Memory::WriteBarrierPtr<Js::WebAssemblyModule>::operator->(&pWVar8->m_module);
      uVar6 = WebAssemblyModule::GetWasmFunctionCount(pWVar9);
      if (UVar1 - uVar5 < uVar6) {
        UVar1 = data->SlotIndex;
        pWVar9 = Memory::WriteBarrierPtr<Js::WebAssemblyModule>::operator->(&pWVar8->m_module);
        uVar5 = WebAssemblyModule::GetFuncOffset(pWVar9);
        pWVar9 = Memory::WriteBarrierPtr<Js::WebAssemblyModule>::operator->(&pWVar8->m_module);
        this_00 = WebAssemblyModule::GetWasmFunctionInfo(pWVar9,UVar1 - uVar5);
        uVar2 = data->Value;
        pFVar10 = Wasm::WasmFunctionInfo::GetBody(this_00);
        iVar7 = (*(pFVar10->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject
                  .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
        Output::Print(L" R%d = %s",(ulong)uVar2,CONCAT44(extraout_var,iVar7));
        return;
      }
    }
    Output::Print(L" R%d = R%d[%d]",(ulong)data->Value,(ulong)data->Instance,(ulong)data->SlotIndex)
    ;
  }
  else if (op == LdSlot_Db) {
    Output::Print(L" D%d = R%d[%d]",(ulong)data->Value,(ulong)data->Instance,(ulong)data->SlotIndex)
    ;
  }
  else if (op == LdSlot_Int) {
    Output::Print(L" I%d = R%d[%d]",(ulong)data->Value,(ulong)data->Instance,(ulong)data->SlotIndex)
    ;
  }
  else if (op == LdSlot_Long) {
    Output::Print(L" L%d = R%d[%d]",(ulong)data->Value,(ulong)data->Instance,(ulong)data->SlotIndex)
    ;
  }
  else if (op == LdSlot_Flt) {
    Output::Print(L" F%d = R%d[%d]",(ulong)data->Value,(ulong)data->Instance,(ulong)data->SlotIndex)
    ;
  }
  else if (op == StSlot_Db) {
    Output::Print(L" R%d[%d] = D%d",(ulong)data->Instance,(ulong)data->SlotIndex,(ulong)data->Value)
    ;
  }
  else if (op == StSlot_Int) {
    Output::Print(L" R%d[%d] = I%d",(ulong)data->Instance,(ulong)data->SlotIndex,(ulong)data->Value)
    ;
  }
  else if (op == StSlot_Long) {
    Output::Print(L" R%d[%d] = L%d",(ulong)data->Instance,(ulong)data->SlotIndex,(ulong)data->Value)
    ;
  }
  else if (op == StSlot_Flt) {
    Output::Print(L" R%d[%d] = F%d",(ulong)data->Instance,(ulong)data->SlotIndex,(ulong)data->Value)
    ;
  }
  else if ((ushort)(op - LdArr_Func) < 2) {
    Output::Print(L" R%d = R%d[I%d]",(ulong)data->Value,(ulong)data->Instance,(ulong)data->SlotIndex
                 );
  }
  else if (op == Simd128_LdSlot_I4) {
    Output::Print(L" I4_%d = R%d[%d]",(ulong)data->Value,(ulong)data->Instance,
                  (ulong)data->SlotIndex);
  }
  else if (op == Simd128_StSlot_I4) {
    Output::Print(L" R%d[%d]  = I4_%d",(ulong)data->Instance,(ulong)data->SlotIndex,
                  (ulong)data->Value);
  }
  else if (op == Simd128_LdSlot_I8) {
    Output::Print(L" I8_%d = R%d[%d]",(ulong)data->Value,(ulong)data->Instance,
                  (ulong)data->SlotIndex);
  }
  else if (op == Simd128_LdSlot_I16) {
    Output::Print(L" I16_%d = R%d[%d]",(ulong)data->Value,(ulong)data->Instance,
                  (ulong)data->SlotIndex);
  }
  else if (op == Simd128_LdSlot_F4) {
    Output::Print(L" F4_%d = R%d[%d]",(ulong)data->Value,(ulong)data->Instance,
                  (ulong)data->SlotIndex);
  }
  else if (op == Simd128_StSlot_F4) {
    Output::Print(L" R%d[%d]  = F4_%d",(ulong)data->Instance,(ulong)data->SlotIndex,
                  (ulong)data->Value);
  }
  else if (op == Simd128_StSlot_I8) {
    Output::Print(L" R%d[%d]  = I8_%d",(ulong)data->Instance,(ulong)data->SlotIndex,
                  (ulong)data->Value);
  }
  else if (op == Simd128_LdSlot_U4) {
    Output::Print(L" U4_%d = R%d[%d]",(ulong)data->Value,(ulong)data->Instance,
                  (ulong)data->SlotIndex);
  }
  else if (op == Simd128_StSlot_U4) {
    Output::Print(L" R%d[%d]  = U4_%d",(ulong)data->Instance,(ulong)data->SlotIndex,
                  (ulong)data->Value);
  }
  else if (op == Simd128_LdSlot_U8) {
    Output::Print(L" U8_%d = R%d[%d]",(ulong)data->Value,(ulong)data->Instance,
                  (ulong)data->SlotIndex);
  }
  else if (op == Simd128_StSlot_U8) {
    Output::Print(L" R%d[%d]  = U8_%d",(ulong)data->Instance,(ulong)data->SlotIndex,
                  (ulong)data->Value);
  }
  else if (op == Simd128_LdSlot_U16) {
    Output::Print(L" U16_%d = R%d[%d]",(ulong)data->Value,(ulong)data->Instance,
                  (ulong)data->SlotIndex);
  }
  else if (op == Simd128_StSlot_U16) {
    Output::Print(L" R%d[%d]  = U16_%d",(ulong)data->Instance,(ulong)data->SlotIndex,
                  (ulong)data->Value);
  }
  else if (op == Simd128_StSlot_I16) {
    Output::Print(L" R%d[%d]  = I16_%d",(ulong)data->Instance,(ulong)data->SlotIndex,
                  (ulong)data->Value);
  }
  else if (op == Simd128_LdSlot_B4) {
    Output::Print(L" B4_%d = R%d[%d]",(ulong)data->Value,(ulong)data->Instance,
                  (ulong)data->SlotIndex);
  }
  else if (op == Simd128_StSlot_B4) {
    Output::Print(L" R%d[%d]  = B4_%d",(ulong)data->Instance,(ulong)data->SlotIndex,
                  (ulong)data->Value);
  }
  else if (op == Simd128_LdSlot_B8) {
    Output::Print(L" B8_%d = R%d[%d]",(ulong)data->Value,(ulong)data->Instance,
                  (ulong)data->SlotIndex);
  }
  else if (op == Simd128_StSlot_B8) {
    Output::Print(L" R%d[%d]  = B8_%d",(ulong)data->Instance,(ulong)data->SlotIndex,
                  (ulong)data->Value);
  }
  else if (op == Simd128_LdSlot_B16) {
    Output::Print(L" B16_%d = R%d[%d]",(ulong)data->Value,(ulong)data->Instance,
                  (ulong)data->SlotIndex);
  }
  else if (op == Simd128_StSlot_B16) {
    Output::Print(L" R%d[%d]  = B16_%d",(ulong)data->Instance,(ulong)data->SlotIndex,
                  (ulong)data->Value);
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeDumper.cpp"
                                ,0x1fe,"(false)","Unknown OpCode for OpLayoutElementSlot");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  return;
}

Assistant:

void AsmJsByteCodeDumper::DumpElementSlot(OpCodeAsmJs op, const unaligned T * data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        switch (op)
        {
        case OpCodeAsmJs::LdSlot:
        case OpCodeAsmJs::LdSlotArr:
        {
#ifdef ENABLE_WASM
            auto asmInfo = dumpFunction->GetAsmJsFunctionInfo();
            auto wasmInfo = asmInfo->GetWasmReaderInfo();
            if (wasmInfo)
            {
                uint index = (uint)data->SlotIndex;
                if (index - wasmInfo->m_module->GetFuncOffset() < wasmInfo->m_module->GetWasmFunctionCount())
                {
                    uint funcIndex = data->SlotIndex - wasmInfo->m_module->GetFuncOffset();
                    auto loadedFunc = wasmInfo->m_module->GetWasmFunctionInfo(funcIndex);
                    Output::Print(_u(" R%d = %s"), data->Value, loadedFunc->GetBody()->GetDisplayName());
                    break;
                }
            }
#endif
            Output::Print(_u(" R%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        }
        case OpCodeAsmJs::LdArr_Func:
        case OpCodeAsmJs::LdArr_WasmFunc:
            Output::Print(_u(" R%d = R%d[I%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        case OpCodeAsmJs::StSlot_Int:
            Output::Print(_u(" R%d[%d] = I%d"), data->Instance, data->SlotIndex, data->Value);
            break;
        case OpCodeAsmJs::StSlot_Long:
            Output::Print(_u(" R%d[%d] = L%d"), data->Instance, data->SlotIndex, data->Value);
            break;
        case OpCodeAsmJs::StSlot_Flt:
            Output::Print(_u(" R%d[%d] = F%d"), data->Instance, data->SlotIndex, data->Value);
            break;
        case OpCodeAsmJs::StSlot_Db:
            Output::Print(_u(" R%d[%d] = D%d"), data->Instance, data->SlotIndex, data->Value);
            break;
        case OpCodeAsmJs::LdSlot_Int:
            Output::Print(_u(" I%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        case OpCodeAsmJs::LdSlot_Long:
            Output::Print(_u(" L%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        case OpCodeAsmJs::LdSlot_Flt:
            Output::Print(_u(" F%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        case OpCodeAsmJs::LdSlot_Db:
            Output::Print(_u(" D%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        case OpCodeAsmJs::Simd128_LdSlot_F4:
            Output::Print(_u(" F4_%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        case OpCodeAsmJs::Simd128_LdSlot_I4:
            Output::Print(_u(" I4_%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        case OpCodeAsmJs::Simd128_LdSlot_I8:
            Output::Print(_u(" I8_%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        case OpCodeAsmJs::Simd128_LdSlot_I16:
            Output::Print(_u(" I16_%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        case OpCodeAsmJs::Simd128_LdSlot_U4:
            Output::Print(_u(" U4_%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        case OpCodeAsmJs::Simd128_LdSlot_U8:
            Output::Print(_u(" U8_%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        case OpCodeAsmJs::Simd128_LdSlot_U16:
            Output::Print(_u(" U16_%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        case OpCodeAsmJs::Simd128_LdSlot_B4:
            Output::Print(_u(" B4_%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        case OpCodeAsmJs::Simd128_LdSlot_B8:
            Output::Print(_u(" B8_%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        case OpCodeAsmJs::Simd128_LdSlot_B16:
            Output::Print(_u(" B16_%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
#if 0
        case OpCodeAsmJs::Simd128_LdSlot_D2:
            Output::Print(_u(" D2_%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;

#endif // 0

        case OpCodeAsmJs::Simd128_StSlot_F4:
            Output::Print(_u(" R%d[%d]  = F4_%d"), data->Instance, data->SlotIndex, data->Value);
            break;
        case OpCodeAsmJs::Simd128_StSlot_I4:
            Output::Print(_u(" R%d[%d]  = I4_%d"), data->Instance, data->SlotIndex, data->Value);
            break;
        case OpCodeAsmJs::Simd128_StSlot_I8:
            Output::Print(_u(" R%d[%d]  = I8_%d"), data->Instance, data->SlotIndex, data->Value);
            break;
        case OpCodeAsmJs::Simd128_StSlot_I16:
            Output::Print(_u(" R%d[%d]  = I16_%d"), data->Instance, data->SlotIndex, data->Value);
            break;
        case OpCodeAsmJs::Simd128_StSlot_U4:
            Output::Print(_u(" R%d[%d]  = U4_%d"), data->Instance, data->SlotIndex, data->Value);
            break;
        case OpCodeAsmJs::Simd128_StSlot_U8:
            Output::Print(_u(" R%d[%d]  = U8_%d"), data->Instance, data->SlotIndex, data->Value);
            break;
        case OpCodeAsmJs::Simd128_StSlot_U16:
            Output::Print(_u(" R%d[%d]  = U16_%d"), data->Instance, data->SlotIndex, data->Value);
            break;
        case OpCodeAsmJs::Simd128_StSlot_B4:
            Output::Print(_u(" R%d[%d]  = B4_%d"), data->Instance, data->SlotIndex, data->Value);
            break;
        case OpCodeAsmJs::Simd128_StSlot_B8:
            Output::Print(_u(" R%d[%d]  = B8_%d"), data->Instance, data->SlotIndex, data->Value);
            break;
        case OpCodeAsmJs::Simd128_StSlot_B16:
            Output::Print(_u(" R%d[%d]  = B16_%d"), data->Instance, data->SlotIndex, data->Value);
            break;
#if 0
        case OpCodeAsmJs::Simd128_StSlot_D2:
            Output::Print(_u(" R%d[%d]  = D2_%d"), data->Instance, data->SlotIndex, data->Value);
            break;
#endif // 0

        default:
        {
            AssertMsg(false, "Unknown OpCode for OpLayoutElementSlot");
            break;
        }
        }
    }